

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::get_argument_address_space_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRVariable *argument)

{
  SPIRType *type_00;
  bool bVar1;
  uint32_t uVar2;
  allocator local_29;
  SPIRType *local_28;
  SPIRType *type;
  SPIRVariable *argument_local;
  CompilerMSL *this_local;
  
  type = (SPIRType *)argument;
  argument_local = (SPIRVariable *)this;
  this_local = (CompilerMSL *)__return_storage_ptr__;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(argument->super_IVariant).field_0xc);
  local_28 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  bVar1 = Compiler::is_physical_pointer((Compiler *)this,local_28);
  type_00 = local_28;
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_29);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    get_type_address_space_abi_cxx11_(__return_storage_ptr__,this,type_00,uVar2,true);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::get_argument_address_space(const SPIRVariable &argument)
{
	const auto &type = get<SPIRType>(argument.basetype);
	// BDA is always passed around by value. There is no storage class for the argument itself.
	if (is_physical_pointer(type))
		return "";
	return get_type_address_space(type, argument.self, true);
}